

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void deltrap(level *lev,trap *trap)

{
  trap *local_20;
  trap *ttmp;
  trap *trap_local;
  level *lev_local;
  
  if (trap == lev->lev_traps) {
    lev->lev_traps = lev->lev_traps->ntrap;
  }
  else {
    for (local_20 = lev->lev_traps; local_20->ntrap != trap; local_20 = local_20->ntrap) {
    }
    local_20->ntrap = trap->ntrap;
  }
  free(trap);
  return;
}

Assistant:

void deltrap(struct level *lev, struct trap *trap)
{
	struct trap *ttmp;

	if (trap == lev->lev_traps)
		lev->lev_traps = lev->lev_traps->ntrap;
	else {
		for (ttmp = lev->lev_traps; ttmp->ntrap != trap; ttmp = ttmp->ntrap) ;
		ttmp->ntrap = trap->ntrap;
	}
	dealloc_trap(trap);
}